

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

void __thiscall Assimp::XGLImporter::ReadLighting(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  aiLight *paVar2;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *s;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  s = (string *)scope;
  scope_local = (TempScope *)this;
  while (bVar1 = ReadElementUpToClosing(this,"lighting"), bVar1) {
    GetElementName_abi_cxx11_(&local_40,this);
    local_20 = &local_40;
    bVar1 = std::operator==(&local_40,"directionallight");
    if (bVar1) {
      paVar2 = ReadDirectionalLight(this);
      s[4].field_2._M_allocated_capacity = (size_type)paVar2;
    }
    else {
      bVar1 = std::operator==(local_20,"ambient");
      if (bVar1) {
        LogFunctions<Assimp::XGLImporter>::LogWarn("ignoring <ambient> tag");
      }
      else {
        bVar1 = std::operator==(local_20,"spheremap");
        if (bVar1) {
          LogFunctions<Assimp::XGLImporter>::LogWarn("ignoring <spheremap> tag");
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void XGLImporter::ReadLighting(TempScope& scope)
{
    while (ReadElementUpToClosing("lighting"))  {
        const std::string& s = GetElementName();
        if (s == "directionallight") {
            scope.light = ReadDirectionalLight();
        }
        else if (s == "ambient") {
            LogWarn("ignoring <ambient> tag");
        }
        else if (s == "spheremap") {
            LogWarn("ignoring <spheremap> tag");
        }
    }
}